

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::errors<char[25],char[54]>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*args) [25],char (*args_1) [54]
          )

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_e3;
  allocator local_e2;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,"constraint not satisfied",&local_e1);
  std::operator+(&local_a0,".*",&local_40);
  std::operator+(&local_80,&local_a0,".*");
  std::__cxx11::string::string
            ((string *)&local_e0,"type_<.*shared_ptr.*int.*>::has_disallowed_qualifiers",&local_e2);
  std::operator+(&local_c0,".*",&local_e0);
  std::operator+(&local_60,&local_c0,".*");
  __l._M_len = 2;
  __l._M_array = &local_80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_e3);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_80._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}